

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *out_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  uint uVar1;
  long lVar2;
  float rounding;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  ImDrawList *in_RDI;
  byte in_R8B;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  int n;
  ImVec2 triangle [3];
  uint idx_n;
  ImDrawListFlags backup_flags;
  ImRect vtxs_rect;
  ImRect clip_rect;
  ImDrawVert *vtx_buffer;
  ImDrawIdx *idx_buffer;
  ImVec4 *in_stack_ffffffffffffff18;
  ImRect *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  float fVar7;
  ImVec2 *local_b0;
  long local_a8;
  byte local_9d;
  int local_7c;
  ImVec2 local_78 [3];
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  ImU32 col;
  ImVec2 in_stack_ffffffffffffffb0;
  ImVec2 in_stack_ffffffffffffffb8;
  ImDrawList *in_stack_ffffffffffffffc0;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  local_9d = 1;
  if ((in_CL & 1) == 0) {
    local_9d = in_R8B & 1;
  }
  if (local_9d != 0) {
    if (*(int *)(in_RSI + 0x10) < 1) {
      local_a8 = 0;
    }
    else {
      local_a8 = *(long *)(in_RSI + 0x18);
    }
    lVar2 = *(long *)(in_RSI + 0x28);
    uVar1 = *(uint *)(in_RDX + 0x18);
    ImRect::ImRect(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (float)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                   (float)in_stack_ffffffffffffff28,
                   (float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                   SUB84(in_stack_ffffffffffffff20,0));
    col = in_RDI->Flags;
    in_RDI->Flags = in_RDI->Flags & 0xfffffffe;
    rounding = *(float *)(in_RDX + 0x1c);
    while ((uint)rounding < (uint)(*(int *)(in_RDX + 0x1c) + *(int *)(in_RDX + 0x20))) {
      local_b0 = local_78;
      do {
        ImVec2::ImVec2(local_b0);
        local_b0 = local_b0 + 1;
      } while (local_b0 != (ImVec2 *)&stack0xffffffffffffffa0);
      for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
        fVar7 = rounding;
        if (local_a8 != 0) {
          fVar7 = (float)(uint)*(ushort *)(local_a8 + (ulong)(uint)rounding * 2);
        }
        local_78[local_7c] = *(ImVec2 *)(lVar2 + (ulong)uVar1 * 0x14 + (ulong)(uint)fVar7 * 0x14);
        ImRect::Add((ImRect *)&stack0xffffffffffffffb0,local_78 + local_7c);
        rounding = (float)((int)rounding + 1);
      }
      if ((in_CL & 1) != 0) {
        ImDrawList::AddPolyline(in_RDI,local_78,3,0xff00ffff,true,1.0);
      }
    }
    if ((in_R8B & 1) != 0) {
      auVar3._0_8_ = ImFloor((ImVec2 *)in_stack_ffffffffffffff18);
      auVar3._8_56_ = extraout_var;
      vmovlpd_avx(auVar3._0_16_);
      auVar4._0_8_ = ImFloor((ImVec2 *)in_stack_ffffffffffffff18);
      auVar4._8_56_ = extraout_var_00;
      vmovlpd_avx(auVar4._0_16_);
      ImDrawList::AddRect(in_stack_ffffffffffffffc0,(ImVec2 *)in_stack_ffffffffffffffb8,
                          (ImVec2 *)in_stack_ffffffffffffffb0,col,rounding,
                          (ImDrawCornerFlags)in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
      auVar5._0_8_ = ImFloor((ImVec2 *)in_stack_ffffffffffffff18);
      auVar5._8_56_ = extraout_var_01;
      vmovlpd_avx(auVar5._0_16_);
      auVar6._0_8_ = ImFloor((ImVec2 *)in_stack_ffffffffffffff18);
      auVar6._8_56_ = extraout_var_02;
      vmovlpd_avx(auVar6._0_16_);
      ImDrawList::AddRect(in_stack_ffffffffffffffc0,(ImVec2 *)in_stack_ffffffffffffffb8,
                          (ImVec2 *)in_stack_ffffffffffffffb0,col,rounding,
                          (ImDrawCornerFlags)in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    }
    in_RDI->Flags = col;
    return;
  }
  __assert_fail("show_mesh || show_aabb",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x2bc9,
                "void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList *, const ImDrawList *, const ImDrawCmd *, bool, bool)"
               );
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList* out_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);
    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
    ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = out_draw_list->Flags;
    out_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset; idx_n < draw_cmd->IdxOffset + draw_cmd->ElemCount; )
    {
        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            out_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        out_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        out_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    out_draw_list->Flags = backup_flags;
}